

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

int __thiscall
cmMakefile::ConfigureFile
          (cmMakefile *this,string *infile,string *outfile,bool copyonly,bool atOnly,
          bool escapeQuotes,mode_t permissions,cmNewLineStyle newLine)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__;
  string *file;
  bool bVar1;
  byte bVar2;
  BOM BVar3;
  char *pcVar4;
  ostream *poVar5;
  string local_8c8;
  Status local_8a8;
  string local_8a0;
  Status local_880;
  undefined1 local_878 [8];
  string outLine;
  string inLine;
  undefined8 local_830;
  string local_828;
  undefined1 local_808 [8];
  ostringstream e;
  undefined1 local_688 [4];
  BOM bom;
  long local_668;
  ifstream fin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  undefined1 local_440 [8];
  ofstream fout;
  cmAlphaNum local_210;
  undefined1 local_1e0 [8];
  string tempOutputFile;
  _Ios_Openmode local_19c;
  string local_198 [4];
  openmode omode;
  string newLineCharacters;
  Status local_154;
  int local_14c;
  string local_148;
  Status local_128;
  Status local_120;
  undefined1 local_118 [8];
  string path;
  size_type pos;
  string *sinfile;
  string soutfile;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  int local_30;
  byte local_2b;
  byte local_2a;
  byte local_29;
  int res;
  bool escapeQuotes_local;
  bool atOnly_local;
  bool copyonly_local;
  string *outfile_local;
  string *infile_local;
  cmMakefile *this_local;
  cmNewLineStyle newLine_local;
  
  this_local._0_4_ = newLine.NewLineStyle;
  local_30 = 1;
  local_2b = escapeQuotes;
  local_2a = atOnly;
  local_29 = copyonly;
  _res = outfile;
  outfile_local = infile;
  infile_local = (string *)this;
  bVar1 = CanIWriteThisFile(this,outfile);
  if (!bVar1) {
    std::operator+(&local_70,"Attempt to write file: ",_res);
    std::operator+(&local_50,&local_70," into a source directory.");
    cmSystemTools::Error(&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    return 0;
  }
  bVar1 = cmsys::SystemTools::FileExists(outfile_local);
  if (!bVar1) {
    __return_storage_ptr__ =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((long)&soutfile.field_2 + 8);
    std::operator+(__return_storage_ptr__,"File ",outfile_local);
    std::operator+(&local_a0,__return_storage_ptr__," does not exist.");
    cmSystemTools::Error(&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)(soutfile.field_2._M_local_buf + 8));
    return 0;
  }
  std::__cxx11::string::string((string *)&sinfile,(string *)_res);
  file = outfile_local;
  AddCMakeDependFile(this,outfile_local);
  cmsys::SystemTools::ConvertToUnixSlashes((string *)&sinfile);
  AddCMakeOutputFile(this,(string *)&sinfile);
  if (permissions == 0) {
    cmsys::SystemTools::GetPermissions(file,&permissions);
  }
  path.field_2._8_8_ = std::__cxx11::string::rfind((char)&sinfile,0x2f);
  if (path.field_2._8_8_ != -1) {
    std::__cxx11::string::substr((ulong)local_118,(ulong)&sinfile);
    local_120 = cmsys::SystemTools::MakeDirectory((string *)local_118,(mode_t *)0x0);
    std::__cxx11::string::~string((string *)local_118);
  }
  if ((local_29 & 1) == 0) {
    std::__cxx11::string::string(local_198);
    local_19c = std::operator|(_S_out,_S_trunc);
    bVar1 = cmNewLineStyle::IsValid((cmNewLineStyle *)&this_local);
    if (bVar1) {
      cmNewLineStyle::GetCharacters_abi_cxx11_
                ((string *)((long)&tempOutputFile.field_2 + 8),(cmNewLineStyle *)&this_local);
      std::__cxx11::string::operator=(local_198,(string *)(tempOutputFile.field_2._M_local_buf + 8))
      ;
      std::__cxx11::string::~string((string *)(tempOutputFile.field_2._M_local_buf + 8));
      std::operator|=(&local_19c,_S_bin);
    }
    else {
      std::__cxx11::string::operator=(local_198,"\n");
    }
    cmAlphaNum::cmAlphaNum(&local_210,(string *)&sinfile);
    cmAlphaNum::cmAlphaNum((cmAlphaNum *)&fout.field_0x1f8,".tmp");
    cmStrCat<>((string *)local_1e0,&local_210,(cmAlphaNum *)&fout.field_0x1f8);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    std::ofstream::ofstream(local_440,pcVar4,local_19c);
    bVar2 = std::ios::operator!((ios *)(local_440 + (long)*(_func_int **)((long)local_440 + -0x18)))
    ;
    if ((bVar2 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      std::ifstream::ifstream(&local_668,pcVar4,_S_in);
      bVar2 = std::ios::operator!((ios *)((long)&local_668 + *(long *)(local_668 + -0x18)));
      if ((bVar2 & 1) == 0) {
        BVar3 = cmsys::FStream::ReadBOM((istream *)&local_668);
        if ((BVar3 == BOM_None) || (BVar3 == BOM_UTF8)) {
          std::fpos<__mbstate_t>::fpos((fpos<__mbstate_t> *)((long)&inLine.field_2 + 8),0);
          std::istream::seekg(&local_668,inLine.field_2._8_8_,local_830);
          std::__cxx11::string::string((string *)(outLine.field_2._M_local_buf + 8));
          std::__cxx11::string::string((string *)local_878);
          while (bVar1 = cmsys::SystemTools::GetLineFromStream
                                   ((istream *)&local_668,(string *)((long)&outLine.field_2 + 8),
                                    (bool *)0x0,0xffffffffffffffff), bVar1) {
            std::__cxx11::string::clear();
            ConfigureString(this,(string *)((long)&outLine.field_2 + 8),(string *)local_878,
                            (bool)(local_2a & 1),(bool)(local_2b & 1));
            poVar5 = std::operator<<((ostream *)local_440,(string *)local_878);
            std::operator<<(poVar5,local_198);
          }
          std::ifstream::close();
          std::ofstream::close();
          local_880 = cmsys::SystemTools::CopyFileIfDifferent
                                ((string *)local_1e0,(string *)&sinfile);
          bVar1 = cmsys::Status::operator_cast_to_bool(&local_880);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_8a8 = cmsys::SystemTools::SetPermissions((string *)&sinfile,permissions,false);
            bVar1 = cmsys::Status::operator_cast_to_bool(&local_8a8);
            if (((bVar1 ^ 0xffU) & 1) != 0) {
              cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
              IssueMessage(this,FATAL_ERROR,&local_8c8);
              std::__cxx11::string::~string((string *)&local_8c8);
              local_30 = 0;
            }
          }
          else {
            cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
            IssueMessage(this,FATAL_ERROR,&local_8a0);
            std::__cxx11::string::~string((string *)&local_8a0);
            local_30 = 0;
          }
          cmsys::SystemTools::RemoveFile((string *)local_1e0);
          std::__cxx11::string::~string((string *)local_878);
          std::__cxx11::string::~string((string *)(outLine.field_2._M_local_buf + 8));
          local_14c = 0;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_808);
          poVar5 = std::operator<<((ostream *)local_808,
                                   "File starts with a Byte-Order-Mark that is not UTF-8:\n  ");
          std::operator<<(poVar5,(string *)file);
          std::__cxx11::ostringstream::str();
          IssueMessage(this,FATAL_ERROR,&local_828);
          std::__cxx11::string::~string((string *)&local_828);
          this_local._4_4_ = 0;
          local_14c = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_808);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_688,"Could not open file for read in copy operation ",file);
        cmSystemTools::Error((string *)local_688);
        std::__cxx11::string::~string((string *)local_688);
        this_local._4_4_ = 0;
        local_14c = 1;
      }
      std::ifstream::~ifstream(&local_668);
    }
    else {
      std::operator+(&local_460,"Could not open file for write in copy operation ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0)
      ;
      cmSystemTools::Error(&local_460);
      std::__cxx11::string::~string((string *)&local_460);
      cmSystemTools::ReportLastSystemError("");
      this_local._4_4_ = 0;
      local_14c = 1;
    }
    std::ofstream::~ofstream(local_440);
    std::__cxx11::string::~string((string *)local_1e0);
    std::__cxx11::string::~string(local_198);
    if (local_14c != 0) goto LAB_0042a54d;
  }
  else {
    local_128 = cmsys::SystemTools::CopyFileIfDifferent(file,(string *)&sinfile);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_128);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      IssueMessage(this,FATAL_ERROR,&local_148);
      std::__cxx11::string::~string((string *)&local_148);
      this_local._4_4_ = 0;
      local_14c = 1;
      goto LAB_0042a54d;
    }
    local_154 = cmsys::SystemTools::SetPermissions((string *)&sinfile,permissions,false);
    bVar1 = cmsys::Status::operator_cast_to_bool(&local_154);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      cmsys::SystemTools::GetLastSystemError_abi_cxx11_();
      IssueMessage(this,FATAL_ERROR,(string *)((long)&newLineCharacters.field_2 + 8));
      std::__cxx11::string::~string((string *)(newLineCharacters.field_2._M_local_buf + 8));
      this_local._4_4_ = 0;
      local_14c = 1;
      goto LAB_0042a54d;
    }
  }
  this_local._4_4_ = local_30;
  local_14c = 1;
LAB_0042a54d:
  std::__cxx11::string::~string((string *)&sinfile);
  return this_local._4_4_;
}

Assistant:

int cmMakefile::ConfigureFile(const std::string& infile,
                              const std::string& outfile, bool copyonly,
                              bool atOnly, bool escapeQuotes,
                              mode_t permissions, cmNewLineStyle newLine)
{
  int res = 1;
  if (!this->CanIWriteThisFile(outfile)) {
    cmSystemTools::Error("Attempt to write file: " + outfile +
                         " into a source directory.");
    return 0;
  }
  if (!cmSystemTools::FileExists(infile)) {
    cmSystemTools::Error("File " + infile + " does not exist.");
    return 0;
  }
  std::string soutfile = outfile;
  const std::string& sinfile = infile;
  this->AddCMakeDependFile(sinfile);
  cmSystemTools::ConvertToUnixSlashes(soutfile);

  // Re-generate if non-temporary outputs are missing.
  // when we finalize the configuration we will remove all
  // output files that now don't exist.
  this->AddCMakeOutputFile(soutfile);

  if (permissions == 0) {
    cmSystemTools::GetPermissions(sinfile, permissions);
  }

  std::string::size_type pos = soutfile.rfind('/');
  if (pos != std::string::npos) {
    std::string path = soutfile.substr(0, pos);
    cmSystemTools::MakeDirectory(path);
  }

  if (copyonly) {
    if (!cmSystemTools::CopyFileIfDifferent(sinfile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
    if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      return 0;
    }
  } else {
    std::string newLineCharacters;
    std::ios::openmode omode = std::ios::out | std::ios::trunc;
    if (newLine.IsValid()) {
      newLineCharacters = newLine.GetCharacters();
      omode |= std::ios::binary;
    } else {
      newLineCharacters = "\n";
    }
    std::string tempOutputFile = cmStrCat(soutfile, ".tmp");
    cmsys::ofstream fout(tempOutputFile.c_str(), omode);
    if (!fout) {
      cmSystemTools::Error("Could not open file for write in copy operation " +
                           tempOutputFile);
      cmSystemTools::ReportLastSystemError("");
      return 0;
    }
    cmsys::ifstream fin(sinfile.c_str());
    if (!fin) {
      cmSystemTools::Error("Could not open file for read in copy operation " +
                           sinfile);
      return 0;
    }

    cmsys::FStream::BOM bom = cmsys::FStream::ReadBOM(fin);
    if (bom != cmsys::FStream::BOM_None && bom != cmsys::FStream::BOM_UTF8) {
      std::ostringstream e;
      e << "File starts with a Byte-Order-Mark that is not UTF-8:\n  "
        << sinfile;
      this->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return 0;
    }
    // rewind to copy BOM to output file
    fin.seekg(0);

    // now copy input to output and expand variables in the
    // input file at the same time
    std::string inLine;
    std::string outLine;
    while (cmSystemTools::GetLineFromStream(fin, inLine)) {
      outLine.clear();
      this->ConfigureString(inLine, outLine, atOnly, escapeQuotes);
      fout << outLine << newLineCharacters;
    }
    // close the files before attempting to copy
    fin.close();
    fout.close();
    if (!cmSystemTools::CopyFileIfDifferent(tempOutputFile, soutfile)) {
      this->IssueMessage(MessageType::FATAL_ERROR,
                         cmSystemTools::GetLastSystemError());
      res = 0;
    } else {
      if (!cmSystemTools::SetPermissions(soutfile, permissions)) {
        this->IssueMessage(MessageType::FATAL_ERROR,
                           cmSystemTools::GetLastSystemError());
        res = 0;
      }
    }
    cmSystemTools::RemoveFile(tempOutputFile);
  }
  return res;
}